

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Asyncify.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_0::AsyncifyLocals::~AsyncifyLocals(AsyncifyLocals *this)

{
  AsyncifyLocals *this_local;
  
  ~AsyncifyLocals(this);
  operator_delete(this,0x1c8);
  return;
}

Assistant:

bool isFunctionParallel() override { return true; }